

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

bool Catch::list(IEventListener *reporter,Config *config)

{
  key_type *pkVar1;
  long lVar2;
  long *plVar3;
  undefined8 *puVar4;
  _Base_ptr p_Var5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
  *pSVar8;
  undefined4 extraout_var_00;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *pvVar9;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  pointer pTVar10;
  iterator iVar11;
  _Rb_tree_node_base *p_Var12;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  key_type *__k;
  char cVar13;
  undefined8 *puVar14;
  pair<std::_Rb_tree_iterator<std::pair<const_Catch::StringRef,_Catch::TagInfo>_>,_bool> pVar15;
  StringRef SVar16;
  vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_> descriptions;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> matchedTestCases;
  map<Catch::StringRef,_Catch::TagInfo,_Catch::Detail::CaseInsensitiveLess,_std::allocator<std::pair<const_Catch::StringRef,_Catch::TagInfo>_>_>
  tagCounts;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  _Rb_tree_node_base local_e8;
  undefined1 local_c8 [8];
  _Rb_tree_node_base _Stack_c0;
  size_t sStack_a0;
  undefined8 local_98;
  Config *local_90;
  pointer local_88;
  pointer local_80;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> local_78;
  _Rb_tree<Catch::StringRef,_std::pair<const_Catch::StringRef,_Catch::TagInfo>,_std::_Select1st<std::pair<const_Catch::StringRef,_Catch::TagInfo>_>,_Catch::Detail::CaseInsensitiveLess,_std::allocator<std::pair<const_Catch::StringRef,_Catch::TagInfo>_>_>
  local_60;
  
  cVar13 = (config->m_data).listTests;
  if ((bool)cVar13 == true) {
    iVar6 = (*(config->super_IConfig)._vptr_IConfig[0xd])(config);
    pSVar8 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
             ::getInternal();
    iVar7 = (*(pSVar8->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[3])(pSVar8);
    pvVar9 = (vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *)
             (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar7) + 0x20))
                       ((long *)CONCAT44(extraout_var_00,iVar7),config);
    filterTests((vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *)local_118,
                pvVar9,(TestSpec *)CONCAT44(extraout_var,iVar6),&config->super_IConfig);
    (*reporter->_vptr_IEventListener[0x16])(reporter,local_118);
    if ((pointer)local_118._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_118._0_8_,local_108._0_8_ - local_118._0_8_);
    }
  }
  local_e8._M_right = (_Base_ptr)reporter;
  local_90 = config;
  if ((config->m_data).listTags == true) {
    iVar6 = (*(config->super_IConfig)._vptr_IConfig[0xd])(config);
    pSVar8 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
             ::getInternal();
    iVar7 = (*(pSVar8->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[3])(pSVar8);
    pvVar9 = (vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *)
             (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar7) + 0x20))
                       ((long *)CONCAT44(extraout_var_02,iVar7),config);
    filterTests(&local_78,pvVar9,(TestSpec *)CONCAT44(extraout_var_01,iVar6),&config->super_IConfig)
    ;
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_88 = local_78.
               super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    if (local_78.super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_78.super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      pTVar10 = local_78.
                super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>.
                _M_impl.super__Vector_impl_data._M_start;
      do {
        pkVar1 = &((pTVar10->m_info->tags).
                   super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>._M_impl.
                   super__Vector_impl_data._M_finish)->original;
        local_80 = pTVar10;
        for (__k = &((pTVar10->m_info->tags).
                     super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>._M_impl.
                     super__Vector_impl_data._M_start)->original; __k != pkVar1; __k = __k + 1) {
          iVar11 = std::
                   _Rb_tree<Catch::StringRef,_std::pair<const_Catch::StringRef,_Catch::TagInfo>,_std::_Select1st<std::pair<const_Catch::StringRef,_Catch::TagInfo>_>,_Catch::Detail::CaseInsensitiveLess,_std::allocator<std::pair<const_Catch::StringRef,_Catch::TagInfo>_>_>
                   ::find(&local_60,__k);
          if ((_Rb_tree_header *)iVar11._M_node == &local_60._M_impl.super__Rb_tree_header) {
            _Stack_c0._M_parent = (_Base_ptr)0x0;
            local_c8 = (undefined1  [8])0x0;
            _Stack_c0._0_8_ = (pointer)0x0;
            _Stack_c0._M_left = &_Stack_c0;
            sStack_a0 = 0;
            local_98 = 0;
            local_118._0_8_ = __k->m_start;
            local_118._8_8_ = __k->m_size;
            local_108._8_4_ = _S_red;
            local_f8._0_8_ = (_Rb_tree_node_base *)0x0;
            local_f8._8_8_ = local_108 + 8;
            local_e8._M_parent = (_Base_ptr)0x0;
            local_e8._M_left = (_Base_ptr)0x0;
            local_e8._0_8_ = local_f8._8_8_;
            _Stack_c0._M_right = _Stack_c0._M_left;
            pVar15 = std::
                     _Rb_tree<Catch::StringRef,std::pair<Catch::StringRef_const,Catch::TagInfo>,std::_Select1st<std::pair<Catch::StringRef_const,Catch::TagInfo>>,Catch::Detail::CaseInsensitiveLess,std::allocator<std::pair<Catch::StringRef_const,Catch::TagInfo>>>
                     ::_M_emplace_unique<std::pair<Catch::StringRef,Catch::TagInfo>>
                               ((_Rb_tree<Catch::StringRef,std::pair<Catch::StringRef_const,Catch::TagInfo>,std::_Select1st<std::pair<Catch::StringRef_const,Catch::TagInfo>>,Catch::Detail::CaseInsensitiveLess,std::allocator<std::pair<Catch::StringRef_const,Catch::TagInfo>>>
                                 *)&local_60,(pair<Catch::StringRef,_Catch::TagInfo> *)local_118);
            iVar11._M_node = (_Base_ptr)pVar15.first._M_node;
            std::
            _Rb_tree<Catch::StringRef,_Catch::StringRef,_std::_Identity<Catch::StringRef>,_std::less<Catch::StringRef>,_std::allocator<Catch::StringRef>_>
            ::~_Rb_tree((_Rb_tree<Catch::StringRef,_Catch::StringRef,_std::_Identity<Catch::StringRef>,_std::less<Catch::StringRef>,_std::allocator<Catch::StringRef>_>
                         *)local_108);
            std::
            _Rb_tree<Catch::StringRef,_Catch::StringRef,_std::_Identity<Catch::StringRef>,_std::less<Catch::StringRef>,_std::allocator<Catch::StringRef>_>
            ::~_Rb_tree((_Rb_tree<Catch::StringRef,_Catch::StringRef,_std::_Identity<Catch::StringRef>,_std::less<Catch::StringRef>,_std::allocator<Catch::StringRef>_>
                         *)local_c8);
          }
          local_118._0_8_ = __k->m_start;
          local_118._8_8_ = __k->m_size;
          *(long *)(iVar11._M_node + 3) = *(long *)(iVar11._M_node + 3) + 1;
          std::
          _Rb_tree<Catch::StringRef,Catch::StringRef,std::_Identity<Catch::StringRef>,std::less<Catch::StringRef>,std::allocator<Catch::StringRef>>
          ::_M_insert_unique<Catch::StringRef_const&>
                    ((_Rb_tree<Catch::StringRef,Catch::StringRef,std::_Identity<Catch::StringRef>,std::less<Catch::StringRef>,std::allocator<Catch::StringRef>>
                      *)&iVar11._M_node[1]._M_left,(StringRef *)local_118);
        }
        pTVar10 = local_80 + 1;
      } while (pTVar10 != local_88);
    }
    local_118._0_8_ = (pointer)0x0;
    local_118._8_8_ = (pointer)0x0;
    local_108._0_8_ = (pointer)0x0;
    std::vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>::reserve
              ((vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_> *)local_118,
               local_60._M_impl.super__Rb_tree_header._M_node_count);
    p_Var5 = local_e8._M_right;
    p_Var12 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
        &local_60._M_impl.super__Rb_tree_header) {
      do {
        std::vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>::emplace_back<Catch::TagInfo>
                  ((vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_> *)local_118,
                   (TagInfo *)&p_Var12[1]._M_left);
        p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12);
      } while ((_Rb_tree_header *)p_Var12 != &local_60._M_impl.super__Rb_tree_header);
    }
    (**(code **)(*(long *)p_Var5 + 0xb8))(p_Var5,local_118);
    std::vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>::~vector
              ((vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_> *)local_118);
    std::
    _Rb_tree<Catch::StringRef,_std::pair<const_Catch::StringRef,_Catch::TagInfo>,_std::_Select1st<std::pair<const_Catch::StringRef,_Catch::TagInfo>_>,_Catch::Detail::CaseInsensitiveLess,_std::allocator<std::pair<const_Catch::StringRef,_Catch::TagInfo>_>_>
    ::~_Rb_tree(&local_60);
    if (local_78.super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.
                      super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.
                            super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.
                            super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    cVar13 = '\x01';
  }
  if ((local_90->m_data).listReporters == true) {
    local_c8 = (undefined1  [8])0x0;
    _Stack_c0._0_8_ = (pointer)0x0;
    _Stack_c0._M_parent = (_Base_ptr)0x0;
    pSVar8 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
             ::getInternal();
    iVar6 = (*(pSVar8->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[2])(pSVar8);
    lVar2 = *(long *)CONCAT44(extraout_var_03,iVar6);
    std::vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>::reserve
              ((vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_> *)
               local_c8,*(size_type *)(lVar2 + 0x40));
    p_Var12 = *(_Rb_tree_node_base **)(lVar2 + 0x30);
    if (p_Var12 != (_Rb_tree_node_base *)(lVar2 + 0x20)) {
      do {
        local_118._0_8_ = (pointer)local_108;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_118,*(long *)(p_Var12 + 1),
                   (long)&(p_Var12[1]._M_parent)->_M_color + *(long *)(p_Var12 + 1));
        (**(code **)(**(long **)(p_Var12 + 2) + 0x18))(local_f8);
        std::vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>::
        emplace_back<Catch::ReporterDescription>
                  ((vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>
                    *)local_c8,(ReporterDescription *)local_118);
        if ((_Rb_tree_node_base *)local_f8._0_8_ != &local_e8) {
          operator_delete((void *)local_f8._0_8_,(ulong)(local_e8._0_8_ + 1));
        }
        if ((pointer)local_118._0_8_ != (pointer)local_108) {
          operator_delete((void *)local_118._0_8_,(ulong)(local_108._0_8_ + 1));
        }
        p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12);
      } while (p_Var12 != (_Rb_tree_node_base *)(lVar2 + 0x20));
    }
    (**(code **)(*(long *)local_e8._M_right + 0xa0))(local_e8._M_right,local_c8);
    std::vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>::~vector
              ((vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_> *)
               local_c8);
    cVar13 = '\x01';
  }
  if ((local_90->m_data).listListeners == true) {
    local_c8 = (undefined1  [8])0x0;
    _Stack_c0._0_8_ = (pointer)0x0;
    _Stack_c0._M_parent = (_Base_ptr)0x0;
    pSVar8 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
             ::getInternal();
    iVar6 = (*(pSVar8->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[2])(pSVar8);
    plVar3 = *(long **)CONCAT44(extraout_var_04,iVar6);
    std::vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>::reserve
              ((vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_> *)
               local_c8,plVar3[1] - *plVar3 >> 3);
    puVar14 = (undefined8 *)*plVar3;
    puVar4 = (undefined8 *)plVar3[1];
    if (puVar14 != puVar4) {
      do {
        SVar16 = (StringRef)(**(code **)(*(long *)*puVar14 + 0x18))();
        local_118 = (undefined1  [16])SVar16;
        (**(code **)(*(long *)*puVar14 + 0x20))(local_108);
        std::vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>::
        emplace_back<Catch::ListenerDescription>
                  ((vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>
                    *)local_c8,(ListenerDescription *)local_118);
        if ((pointer)local_108._0_8_ != (pointer)local_f8) {
          operator_delete((void *)local_108._0_8_,(ulong)(local_f8._0_8_ + 1));
        }
        puVar14 = puVar14 + 1;
      } while (puVar14 != puVar4);
    }
    (**(code **)(*(long *)local_e8._M_right + 0xa8))(local_e8._M_right,local_c8);
    std::vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>::~vector
              ((vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_> *)
               local_c8);
    cVar13 = '\x01';
  }
  return (bool)cVar13;
}

Assistant:

bool list( IEventListener& reporter, Config const& config ) {
        bool listed = false;
        if (config.listTests()) {
            listed = true;
            listTests(reporter, config);
        }
        if (config.listTags()) {
            listed = true;
            listTags(reporter, config);
        }
        if (config.listReporters()) {
            listed = true;
            listReporters(reporter);
        }
        if ( config.listListeners() ) {
            listed = true;
            listListeners( reporter );
        }
        return listed;
    }